

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::LogToAllLogfiles
               (LogSeverity severity,time_point *timestamp,char *message,size_t len)

{
  undefined4 local_2c;
  int i;
  size_t len_local;
  char *message_local;
  time_point *timestamp_local;
  LogSeverity severity_local;
  
  if ((fLB::FLAGS_logtostdout & 1) == 0) {
    local_2c = severity;
    if ((fLB::FLAGS_logtostderr & 1) == 0) {
      for (; -1 < (int)local_2c; local_2c = local_2c - GLOG_WARNING) {
        MaybeLogToLogfile(local_2c,timestamp,message,len);
      }
    }
    else {
      ColoredWriteToStderr(severity,message,len);
    }
  }
  else {
    ColoredWriteToStdout(severity,message,len);
  }
  return;
}

Assistant:

inline void LogDestination::LogToAllLogfiles(
    LogSeverity severity,
    const std::chrono::system_clock::time_point& timestamp, const char* message,
    size_t len) {
  if (FLAGS_logtostdout) {  // global flag: never log to file
    ColoredWriteToStdout(severity, message, len);
  } else if (FLAGS_logtostderr) {  // global flag: never log to file
    ColoredWriteToStderr(severity, message, len);
  } else {
    for (int i = severity; i >= 0; --i) {
      LogDestination::MaybeLogToLogfile(static_cast<LogSeverity>(i), timestamp,
                                        message, len);
    }
  }
}